

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_cmpxchgw_be_ppc64
                   (CPUArchState_conflict21 *env,target_ulong addr,uint32_t cmpv,uint32_t newv,
                   TCGMemOpIdx oi)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t *puVar3;
  bool bVar4;
  uintptr_t unaff_retaddr;
  undefined2 local_34;
  unsigned_short _old;
  uint16_t ret;
  uint16_t *haddr;
  undefined2 local_20;
  TCGMemOpIdx oi_local;
  uint32_t newv_local;
  uint32_t cmpv_local;
  target_ulong addr_local;
  CPUArchState_conflict21 *env_local;
  
  puVar3 = (uint16_t *)atomic_mmu_lookup(env,addr,oi,unaff_retaddr);
  oi_local._0_2_ = (uint16_t)cmpv;
  local_34 = bswap16((uint16_t)oi_local);
  local_20 = (uint16_t)newv;
  uVar1 = bswap16(local_20);
  LOCK();
  uVar2 = *puVar3;
  bVar4 = local_34 == uVar2;
  if (bVar4) {
    *puVar3 = uVar1;
    uVar2 = local_34;
  }
  UNLOCK();
  if (!bVar4) {
    local_34 = uVar2;
  }
  uVar2 = bswap16(local_34);
  return (uint32_t)uVar2;
}

Assistant:

ABI_TYPE ATOMIC_NAME(cmpxchg)(CPUArchState *env, target_ulong addr,
                              ABI_TYPE cmpv, ABI_TYPE newv EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;
#if DATA_SIZE == 16
    ret = atomic16_cmpxchg(haddr, BSWAP(cmpv), BSWAP(newv));
#else
#ifdef _MSC_VER
    ret = atomic_cmpxchg__nocheck((long *)haddr, BSWAP(cmpv), BSWAP(newv));
#else
    ret = atomic_cmpxchg__nocheck(haddr, BSWAP(cmpv), BSWAP(newv));
#endif
#endif
    ATOMIC_MMU_CLEANUP;
    return BSWAP(ret);
}